

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManClockDomainNum(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  bool bVar10;
  
  pVVar2 = p->vRegClasses;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    uVar1 = pVVar2->nSize;
    uVar4 = (ulong)uVar1;
    if (uVar4 == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *pVVar2->pArray;
      if (1 < (int)uVar1) {
        uVar6 = 1;
        do {
          iVar7 = pVVar2->pArray[uVar6];
          if (iVar5 <= iVar7) {
            iVar5 = iVar7;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
    }
    if (0 < (int)uVar1) {
      uVar6 = 0;
      iVar7 = 0;
      do {
        iVar7 = iVar7 + (uint)(pVVar2->pArray[uVar6] == 0);
        uVar6 = uVar6 + 1;
      } while (uVar4 != uVar6);
      if (iVar7 != 0) {
        __assert_fail("Vec_IntCountEntry(p->vRegClasses, 0) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0x50,"int Gia_ManClockDomainNum(Gia_Man_t *)");
      }
    }
    if (0 < iVar5) {
      iVar3 = 0;
      iVar7 = 1;
      do {
        uVar8 = 0;
        if (0 < (int)uVar1) {
          uVar6 = 0;
          iVar9 = 0;
          do {
            iVar9 = iVar9 + (uint)(pVVar2->pArray[uVar6] == iVar7);
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
          uVar8 = (uint)(iVar9 != 0);
        }
        iVar3 = iVar3 + uVar8;
        bVar10 = iVar7 != iVar5;
        iVar7 = iVar7 + 1;
      } while (bVar10);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int Gia_ManClockDomainNum( Gia_Man_t * p )
{
    int i, nDoms, Count = 0;
    if ( p->vRegClasses == NULL )
        return 0;
    nDoms = Vec_IntFindMax(p->vRegClasses);
    assert( Vec_IntCountEntry(p->vRegClasses, 0) == 0 );
    for ( i = 1; i <= nDoms; i++ )
        if ( Vec_IntCountEntry(p->vRegClasses, i) > 0 )
            Count++;
    return Count;    
}